

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O1

void __thiscall pg::SSPMSolver::to_tmp(SSPMSolver *this,int idx)

{
  ulong uVar1;
  int iVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  int *piVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t uVar11;
  
  iVar2 = this->l;
  if (0 < (long)iVar2) {
    puVar3 = (this->pm_b)._bits;
    puVar4 = (this->tmp_b)._bits;
    uVar8 = 0;
    do {
      uVar1 = (long)(idx * iVar2) + uVar8;
      uVar9 = uVar8 >> 6;
      uVar10 = 1L << (uVar8 & 0x3f);
      if ((puVar3[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) {
        uVar11 = ~uVar10 & puVar4[uVar9];
      }
      else {
        uVar11 = uVar10 | puVar4[uVar9];
      }
      puVar4[uVar9] = uVar11;
      uVar8 = uVar8 + 1;
    } while ((long)iVar2 != uVar8);
  }
  if (0 < this->l) {
    piVar5 = this->tmp_d;
    piVar6 = this->pm_d;
    lVar7 = 0;
    do {
      piVar5[lVar7] = piVar6[idx * iVar2 + lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->l);
  }
  return;
}

Assistant:

void
SSPMSolver::to_tmp(int idx)
{
    int base = idx*l;
    for (int i=0; i<l; i++) tmp_b[i] = pm_b[base+i];
    for (int i=0; i<l; i++) tmp_d[i] = pm_d[base+i];
}